

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionMeasurementModel.hpp
# Opt level: O0

void __thiscall
KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
PositionMeasurementModel
          (PositionMeasurementModel<float,_Kalman::StandardBase> *this,float landmark1x,
          float landmark1y,float landmark2x,float landmark2y)

{
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_70;
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_50;
  float local_20;
  float local_1c;
  float landmark2y_local;
  float landmark2x_local;
  float landmark1y_local;
  float landmark1x_local;
  PositionMeasurementModel<float,_Kalman::StandardBase> *this_local;
  
  local_20 = landmark2y;
  local_1c = landmark2x;
  landmark2y_local = landmark1y;
  landmark2x_local = landmark1x;
  _landmark1y_local = this;
  Kalman::
  LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ::LinearizedMeasurementModel
            (&this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            );
  (this->
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ).
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
  ._vptr_MeasurementModel = (_func_int **)&PTR_h_0033fbc0;
  Kalman::Vector<float,_2>::Vector(&this->landmark1);
  Kalman::Vector<float,_2>::Vector(&this->landmark2);
  Eigen::DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator<<
            (&local_50,(DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&this->landmark1,
             &landmark2x_local);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            (&local_50,&landmark2y_local);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_50);
  Eigen::DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator<<
            (&local_70,(DenseBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)&this->landmark2,&local_1c
            );
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_(&local_70,&local_20);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_70);
  Eigen::MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
             &(this->
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
              ).V);
  return;
}

Assistant:

PositionMeasurementModel(T landmark1x, T landmark1y, T landmark2x, T landmark2y)
    {
        // Save landmark positions
        landmark1 << landmark1x, landmark1y;
        landmark2 << landmark2x, landmark2y;
        
        // Setup noise jacobian. As this one is static, we can define it once
        // and do not need to update it dynamically
        this->V.setIdentity();
    }